

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void filemgr_mark_stale(filemgr *file,bid_t offset,size_t length)

{
  uint32_t *puVar1;
  size_t sVar2;
  stale_regions local_50;
  
  if ((length != 0) && (file->stale_list != (list *)0x0)) {
    filemgr_actual_stale_regions(&local_50,file,offset,length);
    if (1 < local_50.n_regions) {
      puVar1 = &(local_50.field_1.regions)->len;
      sVar2 = local_50.n_regions;
      do {
        filemgr_add_stale_block(file,((stale_data *)(puVar1 + -2))->pos,(ulong)*puVar1);
        puVar1 = puVar1 + 10;
        sVar2 = sVar2 - 1;
      } while (sVar2 != 0);
      free(local_50.field_1.regions);
      return;
    }
    if (local_50.n_regions == 1) {
      filemgr_add_stale_block(file,local_50.field_1.region.pos,(ulong)local_50.field_1.region.len);
      return;
    }
  }
  return;
}

Assistant:

void filemgr_mark_stale(struct filemgr *file,
                        bid_t offset,
                        size_t length)
{
    if (file->stale_list && length) {
        size_t i;
        struct stale_regions sr;

        sr = filemgr_actual_stale_regions(file, offset, length);

        if (sr.n_regions > 1) {
            for (i=0; i<sr.n_regions; ++i){
                filemgr_add_stale_block(file, sr.regions[i].pos, sr.regions[i].len);
            }
            free(sr.regions);
        } else if (sr.n_regions == 1) {
            filemgr_add_stale_block(file, sr.region.pos, sr.region.len);
        }
    }
}